

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_do_visit_json(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this,size_t id)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  error_flags eVar5;
  NodeData *pNVar6;
  NodeScalar *pNVar7;
  size_t id_00;
  size_t sVar8;
  char cVar9;
  Tree *this_00;
  csubstr cVar10;
  char *pcStack_58;
  size_t local_50;
  char msg [37];
  
  pNVar6 = Tree::_p(this->m_tree,id);
  if ((~(int)(pNVar6->m_type).type & 0x28U) == 0) {
    builtin_strncpy(msg,"check failed: !m_tree->is_stream(id)",0x25);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_tree->m_callbacks).m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_50 = cVar10.len;
    pcStack_58 = cVar10.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x59d6) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x59d6) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x25,LVar3,(this->m_tree->m_callbacks).m_user_data);
  }
  pNVar6 = Tree::_p(this->m_tree,id);
  if ((~(int)(pNVar6->m_type).type & 3U) == 0) {
    pNVar7 = Tree::keysc(this->m_tree,id);
    pNVar6 = Tree::_p(this->m_tree,id);
    _write_json(this,pNVar7,(NodeType)((pNVar6->m_type).type & ~VAL));
    WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
              ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])0x1e80ab);
    this_00 = this->m_tree;
  }
  else {
    pNVar6 = Tree::_p(this->m_tree,id);
    this_00 = this->m_tree;
    if (((pNVar6->m_type).type & KEYVAL) != VAL) {
      pNVar6 = Tree::_p(this_00,id);
      if (((pNVar6->m_type).type & (STREAM|MAP)) != NOTYPE) {
        pNVar6 = Tree::_p(this->m_tree,id);
        if (((pNVar6->m_type).type & KEY) != NOTYPE) {
          pNVar7 = Tree::keysc(this->m_tree,id);
          pNVar6 = Tree::_p(this->m_tree,id);
          _write_json(this,pNVar7,(NodeType)((pNVar6->m_type).type & ~VAL));
          WriterOStream<std::__cxx11::stringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::stringstream> *)this,(char (*) [3])0x1e80ab);
        }
        pNVar6 = Tree::_p(this->m_tree,id);
        if (((pNVar6->m_type).type & SEQ) == NOTYPE) {
          pNVar6 = Tree::_p(this->m_tree,id);
          if (((pNVar6->m_type).type & MAP) == NOTYPE) goto LAB_0018ff74;
          cVar9 = '{';
        }
        else {
          cVar9 = '[';
        }
        WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_do_write(&this->
                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ,cVar9);
      }
      goto LAB_0018ff74;
    }
  }
  pNVar7 = Tree::valsc(this_00,id);
  pNVar6 = Tree::_p(this->m_tree,id);
  _write_json(this,pNVar7,(NodeType)((pNVar6->m_type).type & ~KEY));
LAB_0018ff74:
  for (id_00 = Tree::first_child(this->m_tree,id); id_00 != 0xffffffffffffffff;
      id_00 = Tree::next_sibling(this->m_tree,id_00)) {
    sVar8 = Tree::first_child(this->m_tree,id);
    if (id_00 != sVar8) {
      WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,',');
    }
    _do_visit_json(this,id_00);
  }
  pNVar6 = Tree::_p(this->m_tree,id);
  cVar9 = ']';
  if (((pNVar6->m_type).type & SEQ) == NOTYPE) {
    pNVar6 = Tree::_p(this->m_tree,id);
    cVar9 = '}';
    if (((pNVar6->m_type).type & MAP) == NOTYPE) {
      return;
    }
  }
  WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_do_write(&this->
               super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,cVar9);
  return;
}

Assistant:

void Emitter<Writer>::_do_visit_json(size_t id)
{
    _RYML_CB_CHECK(m_tree->callbacks(), !m_tree->is_stream(id)); // JSON does not have streams
    if(m_tree->is_keyval(id))
    {
        _writek_json(id);
        this->Writer::_do_write(": ");
        _writev_json(id);
    }
    else if(m_tree->is_val(id))
    {
        _writev_json(id);
    }
    else if(m_tree->is_container(id))
    {
        if(m_tree->has_key(id))
        {
            _writek_json(id);
            this->Writer::_do_write(": ");
        }
        if(m_tree->is_seq(id))
            this->Writer::_do_write('[');
        else if(m_tree->is_map(id))
            this->Writer::_do_write('{');
    }  // container

    for(size_t ich = m_tree->first_child(id); ich != NONE; ich = m_tree->next_sibling(ich))
    {
        if(ich != m_tree->first_child(id))
            this->Writer::_do_write(',');
        _do_visit_json(ich);
    }

    if(m_tree->is_seq(id))
        this->Writer::_do_write(']');
    else if(m_tree->is_map(id))
        this->Writer::_do_write('}');
}